

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

cmRulePlaceholderExpander * __thiscall
cmLocalNinjaGenerator::CreateRulePlaceholderExpander(cmLocalNinjaGenerator *this)

{
  cmRulePlaceholderExpander *pcVar1;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = cmLocalGenerator::CreateRulePlaceholderExpander((cmLocalGenerator *)this);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"$TARGET_IMPLIB","");
  std::__cxx11::string::_M_assign((string *)pcVar1);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return pcVar1;
}

Assistant:

cmRulePlaceholderExpander*
cmLocalNinjaGenerator::CreateRulePlaceholderExpander() const
{
  cmRulePlaceholderExpander* ret =
    this->cmLocalGenerator::CreateRulePlaceholderExpander();
  ret->SetTargetImpLib("$TARGET_IMPLIB");
  return ret;
}